

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O1

bool QBenchmarkValgrindUtils::haveValgrind(void)

{
  char cVar1;
  undefined1 uVar2;
  long in_FS_OFFSET;
  QString local_70;
  QArrayDataPointer<QString> local_58;
  QArrayData *local_40;
  char16_t *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_28,(QObject *)0x0);
  local_40 = (QArrayData *)0x0;
  local_38 = L"valgrind";
  local_30 = 8;
  local_70.d.d = (Data *)0x0;
  local_70.d.ptr = L"--version";
  local_70.d.size = 9;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_58,0,&local_70);
  QList<QString>::end((QList<QString> *)&local_58);
  QProcess::start(&local_28,&local_40,&local_58,3);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,0x10);
    }
  }
  cVar1 = QProcess::waitForStarted((int)&local_28);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = QProcess::waitForFinished((int)&local_28);
  }
  QProcess::~QProcess((QProcess *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QBenchmarkValgrindUtils::haveValgrind()
{
#ifdef NVALGRIND
    return false;
#else
    QProcess process;
    process.start(u"valgrind"_s, QStringList(u"--version"_s));
    return process.waitForStarted() && process.waitForFinished(-1);
#endif
}